

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Metadata google::protobuf::internal::AssignDescriptors
                   (_func_DescriptorTable_ptr *table,once_flag *once,Metadata *metadata)

{
  anon_class_8_1_a8aa2aee local_38;
  Metadata *local_30;
  Metadata *metadata_local;
  once_flag *once_local;
  _func_DescriptorTable_ptr *table_local;
  
  local_38.table = table;
  local_30 = metadata;
  metadata_local = (Metadata *)once;
  once_local = (once_flag *)table;
  std::
  call_once<google::protobuf::internal::AssignDescriptors(google::protobuf::internal::DescriptorTable_const*(*)(),std::once_flag*,google::protobuf::Metadata_const&)::__0>
            (once,&local_38);
  return *local_30;
}

Assistant:

Metadata AssignDescriptors(const DescriptorTable* (*table)(),
                           internal::once_flag* once,
                           const Metadata& metadata) {
  call_once(*once, [=] {
    auto* t = table();
    AssignDescriptorsImpl(t, t->is_eager);
  });

  return metadata;
}